

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::ConvertIntImplInnerSlow
          (anon_unknown_53 *this,IntDigits *as_digits,FormatConversionSpecImpl conv,
          FormatSinkImpl *sink)

{
  bool bVar1;
  FormatConversionChar FVar2;
  int iVar3;
  const_iterator pvVar4;
  unsigned_long *puVar5;
  size_type sVar6;
  FormatSinkImpl *this_00;
  FormatSinkImpl *capacity;
  string_view s;
  string_view s_00;
  string_view sVar7;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  char *local_158;
  char *local_150;
  size_t local_148;
  size_t num_right_spaces;
  size_t num_left_spaces;
  size_t num_zeroes;
  size_t needed;
  size_t precision;
  anon_unknown_53 *paStack_e0;
  bool precision_specified;
  size_t local_d8;
  IntDigits *local_cc;
  undefined1 local_c4 [16];
  undefined1 local_b4 [4];
  undefined1 local_b0 [8];
  string_view base_indicator;
  anon_unknown_53 *local_70;
  string_view sign;
  undefined1 local_50 [8];
  string_view formatted;
  size_t fill;
  FormatSinkImpl *sink_local;
  IntDigits *as_digits_local;
  IntDigits *local_14;
  FormatConversionSpecImpl conv_local;
  size_t *capacity_00;
  
  this_00 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),conv.precision_);
  conv_local._0_4_ = conv._0_4_;
  formatted._M_str = (char *)0x0;
  capacity = this_00;
  local_14 = as_digits;
  iVar3 = FormatConversionSpecImpl::width((FormatConversionSpecImpl *)&local_14);
  if (-1 < iVar3) {
    iVar3 = FormatConversionSpecImpl::width((FormatConversionSpecImpl *)&local_14);
    formatted._M_str = (char *)(long)iVar3;
  }
  _local_50 = IntDigits::without_neg_or_zero((IntDigits *)this);
  sVar7._M_str = (char *)&formatted._M_str;
  sVar7._M_len = formatted._M_len;
  ReducePadding((anon_unknown_53 *)local_50,sVar7,(size_t *)capacity);
  bVar1 = IntDigits::is_negative((IntDigits *)this);
  conv_00.width_ = 0;
  conv_00.conv_ = conv_local.conv_;
  conv_00.flags_ = conv_local.flags_;
  conv_00.length_mod_ = conv_local.length_mod_;
  conv_00._3_1_ = conv_local._3_1_;
  conv_00.precision_._0_1_ = conv_local.conv_;
  conv_00.precision_._1_1_ = conv_local.flags_;
  conv_00.precision_._2_1_ = conv_local.length_mod_;
  conv_00.precision_._3_1_ = conv_local._3_1_;
  capacity_00 = (size_t *)(ulong)(uint)conv_local._0_4_;
  sVar7 = SignColumn((anon_unknown_53 *)(ulong)bVar1,SUB81(local_14,0),conv_00);
  local_70 = (anon_unknown_53 *)sVar7._M_len;
  base_indicator._M_str = (char *)local_70;
  sign._M_len = (size_t)sVar7._M_str;
  s._M_str = (char *)&formatted._M_str;
  s._M_len = sign._M_len;
  ReducePadding(local_70,s,capacity_00);
  local_c4._8_8_ = local_14;
  local_b4[0] = conv_local.conv_;
  local_b4[1] = conv_local.flags_;
  local_b4[2] = conv_local.length_mod_;
  local_b4[3] = conv_local._3_1_;
  local_cc = local_14;
  local_c4[0] = conv_local.conv_;
  local_c4[1] = conv_local.flags_;
  local_c4[2] = conv_local.length_mod_;
  local_c4[3] = conv_local._3_1_;
  conv_01.width_ = 0;
  conv_01.conv_ = conv_local.conv_;
  conv_01.flags_ = conv_local.flags_;
  conv_01.length_mod_ = conv_local.length_mod_;
  conv_01._3_1_ = conv_local._3_1_;
  conv_01.precision_ = (int)capacity_00;
  _local_b0 = BaseIndicator(this,local_14,conv_01);
  paStack_e0 = (anon_unknown_53 *)local_b0;
  local_d8 = base_indicator._M_len;
  s_00._M_str = (char *)&formatted._M_str;
  s_00._M_len = base_indicator._M_len;
  ReducePadding((anon_unknown_53 *)local_b0,s_00,capacity_00);
  iVar3 = FormatConversionSpecImpl::precision((FormatConversionSpecImpl *)&local_14);
  precision._7_1_ = -1 < iVar3;
  if ((bool)precision._7_1_) {
    iVar3 = FormatConversionSpecImpl::precision((FormatConversionSpecImpl *)&local_14);
    local_148 = (size_t)iVar3;
  }
  else {
    local_148 = 1;
  }
  needed = local_148;
  bVar1 = FormatConversionSpecImpl::has_alt_flag((FormatConversionSpecImpl *)&local_14);
  if (((bVar1) &&
      (FVar2 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_14),
      FVar2 == 4)) &&
     ((bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_50), bVar1 ||
      (pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_50),
      *pvVar4 != '0')))) {
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
    num_zeroes = sVar6 + 1;
    puVar5 = std::max<unsigned_long>(&needed,&num_zeroes);
    needed = *puVar5;
  }
  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  num_left_spaces = Excess(sVar6,needed);
  ReducePadding(num_left_spaces,(size_t *)&formatted._M_str);
  bVar1 = FormatConversionSpecImpl::has_left_flag((FormatConversionSpecImpl *)&local_14);
  if (bVar1) {
    local_150 = (char *)0x0;
  }
  else {
    local_150 = formatted._M_str;
  }
  num_right_spaces = (size_t)local_150;
  bVar1 = FormatConversionSpecImpl::has_left_flag((FormatConversionSpecImpl *)&local_14);
  if (bVar1) {
    local_158 = formatted._M_str;
  }
  else {
    local_158 = (char *)0x0;
  }
  if (((precision._7_1_ & 1) == 0) &&
     (bVar1 = FormatConversionSpecImpl::has_zero_flag((FormatConversionSpecImpl *)&local_14), bVar1)
     ) {
    num_left_spaces = (size_t)(local_150 + num_left_spaces);
    num_right_spaces = 0;
  }
  FormatSinkImpl::Append(this_00,num_right_spaces,' ');
  FormatSinkImpl::Append(this_00,sVar7);
  FormatSinkImpl::Append(this_00,_local_b0);
  FormatSinkImpl::Append(this_00,num_left_spaces,'0');
  FormatSinkImpl::Append(this_00,_local_50);
  FormatSinkImpl::Append(this_00,(size_t)local_158,' ');
  return true;
}

Assistant:

bool ConvertIntImplInnerSlow(const IntDigits &as_digits,
                             const FormatConversionSpecImpl conv,
                             FormatSinkImpl *sink) {
  // Print as a sequence of Substrings:
  //   [left_spaces][sign][base_indicator][zeroes][formatted][right_spaces]
  size_t fill = 0;
  if (conv.width() >= 0)
    fill = static_cast<size_t>(conv.width());

  string_view formatted = as_digits.without_neg_or_zero();
  ReducePadding(formatted, &fill);

  string_view sign = SignColumn(as_digits.is_negative(), conv);
  ReducePadding(sign, &fill);

  string_view base_indicator = BaseIndicator(as_digits, conv);
  ReducePadding(base_indicator, &fill);

  bool precision_specified = conv.precision() >= 0;
  size_t precision =
      precision_specified ? static_cast<size_t>(conv.precision()) : size_t{1};

  if (conv.has_alt_flag() &&
      conv.conversion_char() == FormatConversionCharInternal::o) {
    // From POSIX description of the '#' (alt) flag:
    //   "For o conversion, it increases the precision (if necessary) to
    //   force the first digit of the result to be zero."
    if (formatted.empty() || *formatted.begin() != '0') {
      size_t needed = formatted.size() + 1;
      precision = std::max(precision, needed);
    }
  }

  size_t num_zeroes = Excess(formatted.size(), precision);
  ReducePadding(num_zeroes, &fill);

  size_t num_left_spaces = !conv.has_left_flag() ? fill : 0;
  size_t num_right_spaces = conv.has_left_flag() ? fill : 0;

  // From POSIX description of the '0' (zero) flag:
  //   "For d, i, o, u, x, and X conversion specifiers, if a precision
  //   is specified, the '0' flag is ignored."
  if (!precision_specified && conv.has_zero_flag()) {
    num_zeroes += num_left_spaces;
    num_left_spaces = 0;
  }

  sink->Append(num_left_spaces, ' ');
  sink->Append(sign);
  sink->Append(base_indicator);
  sink->Append(num_zeroes, '0');
  sink->Append(formatted);
  sink->Append(num_right_spaces, ' ');
  return true;
}